

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median.h
# Opt level: O0

uint med3char<unsigned_int>(uint a,uint b,uint c)

{
  uint c_local;
  uint b_local;
  uint a_local;
  
  b_local = a;
  if (((a != b) && (b_local = c, c != a)) && (c != b)) {
    b_local = b;
    if (a < b) {
      if ((c <= b) && (b_local = a, a < c)) {
        b_local = c;
      }
    }
    else if ((b <= c) && (b_local = c, a < c)) {
      b_local = a;
    }
  }
  return b_local;
}

Assistant:

CharT
med3char(CharT a, CharT b, CharT c)
{
	if (a == b)           return a;
	if (c == a || c == b) return c;
	if (a < b) {
		if (b < c) return b;
		if (a < c) return c;
		return a;
	}
	if (b > c) return b;
	if (a < c) return a;
	return c;
}